

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O2

ssize_t __thiscall DomGradientStop::read(DomGradientStop *this,int __fd,void *__buf,size_t __nbytes)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  DomColor *this_00;
  size_t __nbytes_00;
  void *__buf_00;
  undefined4 in_register_00000034;
  QXmlStreamReader *this_01;
  long lVar4;
  QXmlStreamAttribute *attribute;
  QXmlStreamAttribute *pQVar5;
  long in_FS_OFFSET;
  QStringView other;
  QStringBuilder<QLatin1String,_const_QStringView_&> local_98;
  QArrayDataPointer<char16_t> local_80;
  QStringView local_68;
  QArrayDataPointer<QXmlStreamAttribute> local_50;
  long local_38;
  
  this_01 = (QXmlStreamReader *)CONCAT44(in_register_00000034,__fd);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QXmlStreamReader::attributes();
  pQVar5 = local_50.ptr;
  for (lVar4 = 0; local_50.size * 0x68 != lVar4; lVar4 = lVar4 + 0x68) {
    local_68.m_data = *(storage_type_conflict **)(pQVar5 + 8);
    local_68.m_size = *(qsizetype *)(pQVar5 + 0x10);
    Qt::Literals::StringLiterals::operator____s((QString *)&local_80,L"position",8);
    local_98.a.m_size = local_80.size;
    local_98.a.m_data = (char *)local_80.ptr;
    bVar2 = comparesEqual(&local_68,(QStringView *)&local_98);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    if (bVar2) {
      local_80.ptr = *(char16_t **)(local_50.ptr + lVar4 + 0x50);
      local_80.d = *(Data **)(local_50.ptr + lVar4 + 0x58);
      dVar1 = (double)QStringView::toDouble((bool *)&local_80);
      this->m_attr_position = dVar1;
      this->m_has_attr_position = true;
    }
    else {
      local_98.a.m_size = 0x15;
      local_98.a.m_data = "Unexpected attribute ";
      local_98.b = &local_68;
      QStringBuilder<QLatin1String,_const_QStringView_&>::convertTo<QString>
                ((QString *)&local_80,&local_98);
      QXmlStreamReader::raiseError((QString *)this_01);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    }
    pQVar5 = pQVar5 + 0x68;
  }
  do {
    while( true ) {
      bVar2 = QXmlStreamReader::hasError(this_01);
      if (bVar2) goto LAB_00158013;
      iVar3 = QXmlStreamReader::readNext();
      if (iVar3 != 4) break;
      local_68.m_size = -0x5555555555555556;
      local_68.m_data = (storage_type_conflict *)0xaaaaaaaaaaaaaaaa;
      local_68 = (QStringView)QXmlStreamReader::name();
      Qt::Literals::StringLiterals::operator____s((QString *)&local_80,L"color",5);
      __nbytes_00 = 0;
      other.m_data = local_80.ptr;
      other.m_size = local_80.size;
      iVar3 = QStringView::compare(&local_68,other,CaseInsensitive);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
      if (iVar3 == 0) {
        this_00 = (DomColor *)operator_new(0x18);
        this_00->m_attr_alpha = 0;
        this_00->m_has_attr_alpha = false;
        *(undefined3 *)&this_00->field_0x5 = 0;
        this_00->m_children = 0;
        this_00->m_red = 0;
        this_00->m_green = 0;
        this_00->m_blue = 0;
        DomColor::read(this_00,__fd,__buf_00,__nbytes_00);
        setElementColor(this,this_00);
      }
      else {
        local_98.a.m_size = 0x13;
        local_98.a.m_data = "Unexpected element ";
        local_98.b = &local_68;
        QStringBuilder<QLatin1String,_const_QStringView_&>::convertTo<QString>
                  ((QString *)&local_80,&local_98);
        QXmlStreamReader::raiseError((QString *)this_01);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
      }
    }
  } while (iVar3 != 5);
LAB_00158013:
  QArrayDataPointer<QXmlStreamAttribute>::~QArrayDataPointer(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void DomGradientStop::read(QXmlStreamReader &reader)
{
    const QXmlStreamAttributes &attributes = reader.attributes();
    for (const QXmlStreamAttribute &attribute : attributes) {
        const auto name = attribute.name();
        if (name == u"position"_s) {
            setAttributePosition(attribute.value().toDouble());
            continue;
        }
        reader.raiseError("Unexpected attribute "_L1 + name);
    }

    while (!reader.hasError()) {
        switch (reader.readNext()) {
        case QXmlStreamReader::StartElement : {
            const auto tag = reader.name();
            if (!tag.compare(u"color"_s, Qt::CaseInsensitive)) {
                auto *v = new DomColor();
                v->read(reader);
                setElementColor(v);
                continue;
            }
            reader.raiseError("Unexpected element "_L1 + tag);
        }
            break;
        case QXmlStreamReader::EndElement :
            return;
        default :
            break;
        }
    }
}